

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ManDumpVerilog(Aig_Man_t *p,char *pFileName)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  Vec_Ptr_t *p_00;
  void *pvVar7;
  FILE *__stream;
  Aig_Obj_t *pAVar8;
  char *pcVar9;
  char *local_a0;
  char *local_90;
  uint local_5c;
  int Counter;
  int nDigits;
  int i;
  Aig_Obj_t *pConst1;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes;
  FILE *pFile;
  char *pFileName_local;
  Aig_Man_t *p_local;
  
  _nDigits = (Aig_Obj_t *)0x0;
  iVar3 = Aig_ManCoNum(p);
  if (iVar3 == 0) {
    printf("Aig_ManDumpBlif(): AIG manager does not have POs.\n");
  }
  else {
    for (Counter = 0; iVar3 = Vec_PtrSize(p->vCos), Counter < iVar3; Counter = Counter + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,Counter);
      pAVar6 = Aig_ObjFanin0(pAVar6);
      iVar3 = Aig_ObjIsConst1(pAVar6);
      if (iVar3 != 0) {
        _nDigits = Aig_ManConst1(p);
      }
    }
    p_00 = Aig_ManDfs(p,1);
    pAVar6 = Aig_ManConst1(p);
    (pAVar6->field_5).iData = 0;
    local_5c = 1;
    for (Counter = 0; iVar3 = Vec_PtrSize(p->vCis), Counter < iVar3; Counter = Counter + 1) {
      pvVar7 = Vec_PtrEntry(p->vCis,Counter);
      *(uint *)((long)pvVar7 + 0x28) = local_5c;
      local_5c = local_5c + 1;
    }
    for (Counter = 0; iVar3 = Vec_PtrSize(p->vCos), Counter < iVar3; Counter = Counter + 1) {
      pvVar7 = Vec_PtrEntry(p->vCos,Counter);
      *(uint *)((long)pvVar7 + 0x28) = local_5c;
      local_5c = local_5c + 1;
    }
    for (Counter = 0; iVar3 = Vec_PtrSize(p_00), Counter < iVar3; Counter = Counter + 1) {
      pvVar7 = Vec_PtrEntry(p_00,Counter);
      *(uint *)((long)pvVar7 + 0x28) = local_5c;
      local_5c = local_5c + 1;
    }
    uVar4 = Abc_Base10Log(local_5c);
    __stream = fopen(pFileName,"w");
    fprintf(__stream,"// Verilog file written by procedure Aig_ManDumpVerilog()\n");
    iVar3 = Aig_ManRegNum(p);
    if (iVar3 == 0) {
      if (p->pName == (char *)0x0) {
        local_a0 = "test";
      }
      else {
        local_a0 = p->pName;
      }
      fprintf(__stream,"module %s (",local_a0);
    }
    else {
      if (p->pName == (char *)0x0) {
        local_90 = "test";
      }
      else {
        local_90 = p->pName;
      }
      fprintf(__stream,"module %s ( clock",local_90);
    }
    Counter = 0;
    while( true ) {
      iVar3 = Aig_ManCiNum(p);
      iVar5 = Aig_ManRegNum(p);
      if (iVar3 - iVar5 <= Counter) break;
      pvVar7 = Vec_PtrEntry(p->vCis,Counter);
      iVar3 = Aig_ManRegNum(p);
      pcVar9 = "";
      if (iVar3 != 0 || Counter != 0) {
        pcVar9 = ",";
      }
      fprintf(__stream,"%s n%0*d",pcVar9,(ulong)uVar4,(ulong)*(uint *)((long)pvVar7 + 0x28));
      Counter = Counter + 1;
    }
    Counter = 0;
    while( true ) {
      iVar3 = Aig_ManCoNum(p);
      iVar5 = Aig_ManRegNum(p);
      if (iVar3 - iVar5 <= Counter) break;
      pvVar7 = Vec_PtrEntry(p->vCos,Counter);
      fprintf(__stream,", n%0*d",(ulong)uVar4,(ulong)*(uint *)((long)pvVar7 + 0x28));
      Counter = Counter + 1;
    }
    fprintf(__stream," );\n");
    iVar3 = Aig_ManRegNum(p);
    if (iVar3 != 0) {
      fprintf(__stream,"input clock;\n");
    }
    Counter = 0;
    while( true ) {
      iVar3 = Aig_ManCiNum(p);
      iVar5 = Aig_ManRegNum(p);
      if (iVar3 - iVar5 <= Counter) break;
      pvVar7 = Vec_PtrEntry(p->vCis,Counter);
      fprintf(__stream,"input n%0*d;\n",(ulong)uVar4,(ulong)*(uint *)((long)pvVar7 + 0x28));
      Counter = Counter + 1;
    }
    Counter = 0;
    while( true ) {
      iVar3 = Aig_ManCoNum(p);
      iVar5 = Aig_ManRegNum(p);
      if (iVar3 - iVar5 <= Counter) break;
      pvVar7 = Vec_PtrEntry(p->vCos,Counter);
      fprintf(__stream,"output n%0*d;\n",(ulong)uVar4,(ulong)*(uint *)((long)pvVar7 + 0x28));
      Counter = Counter + 1;
    }
    iVar3 = Aig_ManRegNum(p);
    if (iVar3 != 0) {
      for (Counter = 0; iVar3 = Aig_ManRegNum(p), Counter < iVar3; Counter = Counter + 1) {
        Aig_ManLi(p,Counter);
        pAVar6 = Aig_ManLo(p,Counter);
        fprintf(__stream,"reg n%0*d;\n",(ulong)uVar4,(ulong)(uint)(pAVar6->field_5).iData);
      }
      for (Counter = 0; iVar3 = Aig_ManRegNum(p), Counter < iVar3; Counter = Counter + 1) {
        pAVar6 = Aig_ManLi(p,Counter);
        Aig_ManLo(p,Counter);
        fprintf(__stream,"wire n%0*d;\n",(ulong)uVar4,(ulong)(uint)(pAVar6->field_5).iData);
      }
    }
    for (Counter = 0; iVar3 = Vec_PtrSize(p_00), Counter < iVar3; Counter = Counter + 1) {
      pvVar7 = Vec_PtrEntry(p_00,Counter);
      fprintf(__stream,"wire n%0*d;\n",(ulong)uVar4,(ulong)*(uint *)((long)pvVar7 + 0x28));
    }
    if (_nDigits != (Aig_Obj_t *)0x0) {
      fprintf(__stream,"wire n%0*d;\n",(ulong)uVar4,(ulong)(uint)(_nDigits->field_5).iData);
      fprintf(__stream,"assign n%0*d = 1\'b1;\n",(ulong)uVar4,(ulong)(uint)(_nDigits->field_5).iData
             );
    }
    for (Counter = 0; iVar3 = Vec_PtrSize(p_00), Counter < iVar3; Counter = Counter + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_00,Counter);
      uVar1 = (pAVar6->field_5).iData;
      iVar3 = Aig_ObjFaninC0(pAVar6);
      pcVar9 = " & ~";
      if (iVar3 == 0) {
        pcVar9 = "\r\n\t ";
      }
      pAVar8 = Aig_ObjFanin0(pAVar6);
      iVar3 = (pAVar8->field_5).iData;
      iVar5 = Aig_ObjFaninC1(pAVar6);
      pcVar2 = " & ~";
      if (iVar5 == 0) {
        pcVar2 = "\r\n\t ";
      }
      pAVar6 = Aig_ObjFanin1(pAVar6);
      fprintf(__stream,"assign n%0*d = %sn%0*d & %sn%0*d;\n",(ulong)uVar4,(ulong)uVar1,pcVar9 + 3,
              (ulong)uVar4,iVar3,pcVar2 + 3,uVar4,(pAVar6->field_5).iData);
    }
    Counter = 0;
    while( true ) {
      iVar3 = Aig_ManCoNum(p);
      iVar5 = Aig_ManRegNum(p);
      if (iVar3 - iVar5 <= Counter) break;
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,Counter);
      uVar1 = (pAVar6->field_5).iData;
      iVar3 = Aig_ObjFaninC0(pAVar6);
      pcVar9 = " & ~";
      if (iVar3 == 0) {
        pcVar9 = "\r\n\t ";
      }
      pAVar6 = Aig_ObjFanin0(pAVar6);
      fprintf(__stream,"assign n%0*d = %sn%0*d;\n",(ulong)uVar4,(ulong)uVar1,pcVar9 + 3,(ulong)uVar4
              ,(pAVar6->field_5).iData);
      Counter = Counter + 1;
    }
    iVar3 = Aig_ManRegNum(p);
    if (iVar3 != 0) {
      for (Counter = 0; iVar3 = Aig_ManRegNum(p), Counter < iVar3; Counter = Counter + 1) {
        pAVar6 = Aig_ManLi(p,Counter);
        Aig_ManLo(p,Counter);
        uVar1 = (pAVar6->field_5).iData;
        iVar3 = Aig_ObjFaninC0(pAVar6);
        pcVar9 = " & ~";
        if (iVar3 == 0) {
          pcVar9 = "\r\n\t ";
        }
        pAVar6 = Aig_ObjFanin0(pAVar6);
        fprintf(__stream,"assign n%0*d = %sn%0*d;\n",(ulong)uVar4,(ulong)uVar1,pcVar9 + 3,
                (ulong)uVar4,(pAVar6->field_5).iData);
      }
    }
    iVar3 = Aig_ManRegNum(p);
    if (iVar3 != 0) {
      for (Counter = 0; iVar3 = Aig_ManRegNum(p), Counter < iVar3; Counter = Counter + 1) {
        pAVar6 = Aig_ManLi(p,Counter);
        pAVar8 = Aig_ManLo(p,Counter);
        fprintf(__stream,"always @ (posedge clock) begin n%0*d <= n%0*d; end\n",(ulong)uVar4,
                (ulong)(uint)(pAVar8->field_5).iData,(ulong)uVar4,
                (ulong)(uint)(pAVar6->field_5).iData);
      }
      for (Counter = 0; iVar3 = Aig_ManRegNum(p), Counter < iVar3; Counter = Counter + 1) {
        Aig_ManLi(p,Counter);
        pAVar6 = Aig_ManLo(p,Counter);
        fprintf(__stream,"initial begin n%0*d <= 1\'b0; end\n",(ulong)uVar4,
                (ulong)(uint)(pAVar6->field_5).iData);
      }
    }
    fprintf(__stream,"endmodule\n\n");
    fclose(__stream);
    Vec_PtrFree(p_00);
  }
  return;
}

Assistant:

void Aig_ManDumpVerilog( Aig_Man_t * p, char * pFileName )
{
    FILE * pFile;
    Vec_Ptr_t * vNodes;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pConst1 = NULL;
    int i, nDigits, Counter = 0;
    if ( Aig_ManCoNum(p) == 0 )
    {
        printf( "Aig_ManDumpBlif(): AIG manager does not have POs.\n" );
        return;
    }
    // check if constant is used
    Aig_ManForEachCo( p, pObj, i )
        if ( Aig_ObjIsConst1(Aig_ObjFanin0(pObj)) )
            pConst1 = Aig_ManConst1(p);
    // collect nodes in the DFS order
    vNodes = Aig_ManDfs( p, 1 );
    // assign IDs to objects
    Aig_ManConst1(p)->iData = Counter++;
    Aig_ManForEachCi( p, pObj, i )
        pObj->iData = Counter++;
    Aig_ManForEachCo( p, pObj, i )
        pObj->iData = Counter++;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        pObj->iData = Counter++;
    nDigits = Abc_Base10Log( Counter );
    // write the file
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "// Verilog file written by procedure Aig_ManDumpVerilog()\n" );
//    fprintf( pFile, "// http://www.eecs.berkeley.edu/~alanmi/abc/\n" );
    if ( Aig_ManRegNum(p) )
        fprintf( pFile, "module %s ( clock", p->pName? p->pName: "test" );
    else
        fprintf( pFile, "module %s (", p->pName? p->pName: "test" );
    Aig_ManForEachPiSeq( p, pObj, i )
        fprintf( pFile, "%s n%0*d", ((Aig_ManRegNum(p) || i)? ",":""), nDigits, pObj->iData );
    Aig_ManForEachPoSeq( p, pObj, i )
        fprintf( pFile, ", n%0*d", nDigits, pObj->iData );
    fprintf( pFile, " );\n" );

    // write PIs
    if ( Aig_ManRegNum(p) )
        fprintf( pFile, "input clock;\n" );
    Aig_ManForEachPiSeq( p, pObj, i )
        fprintf( pFile, "input n%0*d;\n", nDigits, pObj->iData );
    // write POs
    Aig_ManForEachPoSeq( p, pObj, i )
        fprintf( pFile, "output n%0*d;\n", nDigits, pObj->iData );
    // write latches
    if ( Aig_ManRegNum(p) )
    {
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        fprintf( pFile, "reg n%0*d;\n", nDigits, pObjLo->iData );
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        fprintf( pFile, "wire n%0*d;\n", nDigits, pObjLi->iData );
    }
    // write nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        fprintf( pFile, "wire n%0*d;\n", nDigits, pObj->iData );
    if ( pConst1 )
        fprintf( pFile, "wire n%0*d;\n", nDigits, pConst1->iData );
    // write nodes
    if ( pConst1 )
        fprintf( pFile, "assign n%0*d = 1\'b1;\n", nDigits, pConst1->iData );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        fprintf( pFile, "assign n%0*d = %sn%0*d & %sn%0*d;\n", 
            nDigits, pObj->iData,
            !Aig_ObjFaninC0(pObj) ? " " : "~", nDigits, Aig_ObjFanin0(pObj)->iData, 
            !Aig_ObjFaninC1(pObj) ? " " : "~", nDigits, Aig_ObjFanin1(pObj)->iData
            );
    }
    // write POs
    Aig_ManForEachPoSeq( p, pObj, i )
    {
        fprintf( pFile, "assign n%0*d = %sn%0*d;\n", 
            nDigits, pObj->iData,
            !Aig_ObjFaninC0(pObj) ? " " : "~", nDigits, Aig_ObjFanin0(pObj)->iData );
    }
    if ( Aig_ManRegNum(p) )
    {
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        {
            fprintf( pFile, "assign n%0*d = %sn%0*d;\n", 
                nDigits, pObjLi->iData,
                !Aig_ObjFaninC0(pObjLi) ? " " : "~", nDigits, Aig_ObjFanin0(pObjLi)->iData );
        }
    }

    // write initial state
    if ( Aig_ManRegNum(p) )
    {
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
            fprintf( pFile, "always @ (posedge clock) begin n%0*d <= n%0*d; end\n", 
                 nDigits, pObjLo->iData,
                 nDigits, pObjLi->iData );
        Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
            fprintf( pFile, "initial begin n%0*d <= 1\'b0; end\n", 
                 nDigits, pObjLo->iData );
    }

    fprintf( pFile, "endmodule\n\n" );
    fclose( pFile );
    Vec_PtrFree( vNodes );
}